

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void anon_unknown.dwarf_8df1c::FinalizeAlignment(TypeStruct *type)

{
  uint local_28;
  uint local_24;
  MemberHandle *local_20;
  MemberHandle *curr;
  uint maximumAlignment;
  TypeStruct *type_local;
  
  curr._4_4_ = 0;
  for (local_20 = (type->members).head; local_20 != (MemberHandle *)0x0; local_20 = local_20->next)
  {
    if (local_20->variable->alignment < curr._4_4_) {
      local_24 = curr._4_4_;
    }
    else {
      local_24 = local_20->variable->alignment;
    }
    curr._4_4_ = local_24;
    if ((local_20->variable->type->hasPointers & 1U) != 0) {
      (type->super_TypeBase).hasPointers = true;
    }
  }
  if ((type->super_TypeBase).alignment == 0) {
    (type->super_TypeBase).alignment = curr._4_4_;
  }
  if ((type->super_TypeBase).alignment < 4) {
    local_28 = 4;
  }
  else {
    local_28 = (type->super_TypeBase).alignment;
  }
  if ((type->super_TypeBase).size % (long)(ulong)local_28 != 0) {
    (type->super_TypeBase).padding =
         local_28 - (int)((type->super_TypeBase).size % (long)(ulong)local_28);
    (type->super_TypeBase).size =
         (ulong)(type->super_TypeBase).padding + (type->super_TypeBase).size;
    type->typeScope->dataSize = (ulong)(type->super_TypeBase).padding + type->typeScope->dataSize;
  }
  return;
}

Assistant:

void FinalizeAlignment(TypeStruct *type)
	{
		unsigned maximumAlignment = 0;

		// Additional padding may apply to preserve the alignment of members
		for(MemberHandle *curr = type->members.head; curr; curr = curr->next)
		{
			maximumAlignment = maximumAlignment > curr->variable->alignment ? maximumAlignment : curr->variable->alignment;

			if(curr->variable->type->hasPointers)
				type->hasPointers = true;
		}

		// If explicit alignment is not specified, then class must be aligned to the maximum alignment of the members
		if(type->alignment == 0)
			type->alignment = maximumAlignment;

		// In NULLC, all classes have sizes multiple of 4, so add additional padding if necessary
		maximumAlignment = type->alignment < 4 ? 4 : type->alignment;

		if(type->size % maximumAlignment != 0)
		{
			type->padding = maximumAlignment - (type->size % maximumAlignment);

			type->size += type->padding;
			type->typeScope->dataSize += type->padding;
		}
	}